

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QLocalePrivate * findLocalePrivate(Language language,Script script,Territory territory)

{
  long lVar1;
  Type *this;
  QLocalePrivate *pQVar2;
  Int IVar3;
  QLocaleId lid;
  undefined6 in_register_0000003a;
  QLocaleData *data;
  QLocaleData *pQVar4;
  
  if ((int)CONCAT62(in_register_0000003a,language) == 1) {
    return (QLocalePrivate *)c_private()::c_locale;
  }
  lid.territory_id = territory;
  lid.script_id = script;
  lid.language_id = language;
  lVar1 = QLocaleData::findLocaleIndex(lid);
  if (locale_data[lVar1].m_language_id == 1) {
    IVar3 = 0;
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>::guard._q_value.
        super___atomic_base<signed_char>._M_i == -1) {
      this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
             ::instance();
      pQVar2 = QSharedDataPointer<QLocalePrivate>::data(this);
      IVar3 = (pQVar2->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
              super_QFlagsStorage<QLocale::NumberOption>.i;
    }
    if (default_data == (QLocaleData *)0x0) {
      default_data = locale_data;
    }
    lVar1 = (long)&default_data[-0x27d8].m_startListPattern_size / 0x7c;
    pQVar4 = default_data;
  }
  else {
    pQVar4 = locale_data + lVar1;
    IVar3 = 0;
  }
  pQVar2 = (QLocalePrivate *)operator_new(0x20);
  pQVar2->m_data = pQVar4;
  (pQVar2->ref)._q_value.super___atomic_base<int>._M_i = 0;
  pQVar2->m_index = lVar1;
  (pQVar2->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i = IVar3;
  return pQVar2;
}

Assistant:

static QLocalePrivate *findLocalePrivate(QLocale::Language language, QLocale::Script script,
                                         QLocale::Territory territory)
{
    if (language == QLocale::C)
        return c_private();

    qsizetype index = QLocaleData::findLocaleIndex(QLocaleId { language, script, territory });
    Q_ASSERT(index >= 0 && index < locale_data_size);
    const QLocaleData *data = locale_data + index;

    QLocale::NumberOptions numberOptions = QLocale::DefaultNumberOptions;

    // If not found, should use default locale:
    if (data->m_language_id == QLocale::C) {
        if (defaultLocalePrivate.exists())
            numberOptions = defaultLocalePrivate->data()->m_numberOptions;
        data = defaultData();
        index = defaultIndex();
    }
    return new QLocalePrivate(data, index, numberOptions);
}